

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

string * __thiscall
Assimp::FBX::FBXConverter::NameTransformationChainNode
          (string *__return_storage_ptr__,FBXConverter *this,string *name,TransformationComp comp)

{
  char *__rhs;
  FBXConverter *this_00;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_60 + 0x20),"_$AssimpFbx$",&local_81);
  std::operator+(&local_80,name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_60 + 0x20));
  this_00 = (FBXConverter *)local_60;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 &local_80,"_");
  __rhs = NameTransformationComp(this_00,comp);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,__rhs
                );
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)(local_60 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::NameTransformationChainNode(const std::string& name, TransformationComp comp)
        {
            return name + std::string(MAGIC_NODE_TAG) + "_" + NameTransformationComp(comp);
        }